

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetpmu.c
# Opt level: O0

int gf100_pte_from_pde(uint64_t chan_ptr,uint64_t *pte,int *hostmem)

{
  uint uVar1;
  uint32_t pde;
  uint32_t pd;
  uint32_t lo;
  uint32_t hi;
  int *hostmem_local;
  uint64_t *pte_local;
  uint64_t chan_ptr_local;
  
  poke(0x1700,(uint)(chan_ptr >> 0x10) & 0xffffff | 0x2000000);
  uVar1 = peek(((uint)chan_ptr & 0xffff) + 0x700200);
  poke(0x1700,uVar1 >> 0x10);
  uVar1 = peek((uVar1 & 0xffff) + 0x70000c);
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"Page directory entry invalid\n");
    chan_ptr_local._4_4_ = -1;
  }
  else {
    *hostmem = 1;
    *pte = ((ulong)uVar1 & 0xfffffff0) << 8;
    chan_ptr_local._4_4_ = 0;
  }
  return chan_ptr_local._4_4_;
}

Assistant:

int gf100_pte_from_pde(uint64_t chan_ptr, uint64_t *pte, int *hostmem)
{
	uint32_t hi, lo;
	uint32_t pd, pde;

	hi = (chan_ptr >> 16) & 0xffffff;
	lo = (chan_ptr & 0x0000ffff);

	poke(0x1700, hi | 0x2000000);
	pd = peek(0x700000+lo+0x200);

	/* Level of indirection. VRAM */
	poke(0x1700, pd >> 16);
	lo = pd & 0xffff;
	pde = peek(0x700000+lo+0xc);
	if (!(pde & 0x1)) {
		fprintf(stderr,"Page directory entry invalid\n");
		return -1;
	}

	*hostmem = 1;
	*pte = ((uint64_t)(pde) & 0xfffffff0ull) << 8ull;

	return 0;
}